

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O0

void __thiscall XipFile::deletefile(XipFile *this,string *romname)

{
  bool bVar1;
  undefined8 uVar2;
  pointer ppVar3;
  element_type *peVar4;
  _Self local_28;
  _Self local_20;
  iterator fi;
  string *romname_local;
  XipFile *this_local;
  
  fi._M_node = (_Base_ptr)romname;
  local_20._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<XipFile::XipEntry>,_caseinsensitive,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<XipFile::XipEntry>_>_>_>
       ::find(&this->_files,romname);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<XipFile::XipEntry>,_caseinsensitive,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<XipFile::XipEntry>_>_>_>
       ::end(&this->_files);
  bVar1 = std::operator==(&local_20,&local_28);
  if (bVar1) {
    uVar2 = std::__cxx11::string::c_str();
    printf("deletefile: %s not found\n",uVar2);
  }
  else {
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<XipFile::XipEntry>_>_>
             ::operator->(&local_20);
    peVar4 = std::__shared_ptr_access<XipFile::XipEntry,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<XipFile::XipEntry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&ppVar3->second);
    (*peVar4->_vptr_XipEntry[7])(peVar4,this,&this->_mm);
    std::
    map<std::__cxx11::string,std::shared_ptr<XipFile::XipEntry>,caseinsensitive,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<XipFile::XipEntry>>>>
    ::erase_abi_cxx11_((map<std::__cxx11::string,std::shared_ptr<XipFile::XipEntry>,caseinsensitive,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<XipFile::XipEntry>>>>
                        *)&this->_files,(iterator)local_20._M_node);
    clearromhdr(this);
  }
  return;
}

Assistant:

virtual void deletefile(const std::string&romname)
    {
        filemap_t::iterator fi= _files.find(romname);
        if (fi==_files.end()) {
            printf("deletefile: %s not found\n", romname.c_str());
            return;
        }
        fi->second->deletefile(*this, _mm);

        _files.erase(fi);
        clearromhdr();
    }